

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcRefactor.c
# Opt level: O2

word * Abc_NodeConeTruth(Vec_Ptr_t *vVars,Vec_Ptr_t *vFuncs,int nWordsMax,Abc_Obj_t *pRoot,
                        Vec_Ptr_t *vLeaves,Vec_Ptr_t *vVisited)

{
  long lVar1;
  byte bVar2;
  void *pvVar3;
  void *pvVar4;
  void **__ptr;
  long *plVar5;
  word *pwVar6;
  int iVar7;
  long lVar8;
  word *pwVar9;
  word *pwVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  uint uVar14;
  Abc_Obj_t *pRoot_local;
  
  iVar12 = vLeaves->nSize;
  bVar2 = (char)iVar12 - 6U & 0x1f;
  pRoot_local = pRoot;
  Abc_NodeConeCollect(&pRoot_local,1,vLeaves,vVisited,0);
  for (iVar11 = 0; iVar11 < vLeaves->nSize; iVar11 = iVar11 + 1) {
    pvVar3 = Vec_PtrEntry(vLeaves,iVar11);
    pvVar4 = Vec_PtrEntry(vVars,iVar11);
    *(void **)((long)pvVar3 + 0x40) = pvVar4;
  }
  iVar11 = vFuncs->nSize;
  for (iVar13 = iVar11; iVar7 = vVisited->nSize, iVar13 < iVar7; iVar13 = iVar13 + 1) {
    pvVar3 = malloc((long)nWordsMax << 3);
    if (iVar11 == vFuncs->nCap) {
      uVar14 = iVar11 * 2;
      if (iVar11 < 0x10) {
        uVar14 = 0x10;
      }
      __ptr = vFuncs->pArray;
      if (iVar11 < (int)uVar14) {
        if (__ptr == (void **)0x0) {
          __ptr = (void **)malloc((ulong)uVar14 << 3);
        }
        else {
          __ptr = (void **)realloc(__ptr,(ulong)uVar14 << 3);
          iVar11 = vFuncs->nSize;
        }
        vFuncs->pArray = __ptr;
        vFuncs->nCap = uVar14;
      }
    }
    else {
      __ptr = vFuncs->pArray;
    }
    lVar8 = (long)iVar11;
    iVar11 = iVar11 + 1;
    vFuncs->nSize = iVar11;
    __ptr[lVar8] = pvVar3;
  }
  pwVar6 = (word *)0x0;
  pwVar10 = (word *)(ulong)(uint)(1 << bVar2);
  if (1 << bVar2 < 1) {
    pwVar10 = pwVar6;
  }
  if (iVar12 < 7) {
    pwVar10 = (word *)0x1;
  }
  iVar12 = 0;
  while( true ) {
    if (iVar7 <= iVar12) {
      return pwVar6;
    }
    plVar5 = (long *)Vec_PtrEntry(vVisited,iVar12);
    if ((*(uint *)((long)plVar5 + 0x14) & 0xf) == 2) break;
    lVar8 = *(long *)(*(long *)(*plVar5 + 0x20) + 8);
    lVar1 = *(long *)(*(long *)(lVar8 + (long)*(int *)plVar5[4] * 8) + 0x40);
    lVar8 = *(long *)(*(long *)(lVar8 + (long)((int *)plVar5[4])[1] * 8) + 0x40);
    pwVar6 = (word *)Vec_PtrEntry(vFuncs,iVar12);
    uVar14 = *(uint *)((long)plVar5 + 0x14);
    if ((uVar14 >> 10 & 1) == 0) {
      if ((uVar14 >> 0xb & 1) == 0) {
        for (pwVar9 = (word *)0x0; pwVar10 != pwVar9; pwVar9 = (word *)((long)pwVar9 + 1)) {
          pwVar6[(long)pwVar9] =
               *(ulong *)(lVar8 + (long)pwVar9 * 8) & *(ulong *)(lVar1 + (long)pwVar9 * 8);
        }
      }
      else {
        for (pwVar9 = (word *)0x0; pwVar10 != pwVar9; pwVar9 = (word *)((long)pwVar9 + 1)) {
          pwVar6[(long)pwVar9] =
               ~*(ulong *)(lVar8 + (long)pwVar9 * 8) & *(ulong *)(lVar1 + (long)pwVar9 * 8);
        }
      }
    }
    else if ((uVar14 >> 0xb & 1) == 0) {
      for (pwVar9 = (word *)0x0; pwVar10 != pwVar9; pwVar9 = (word *)((long)pwVar9 + 1)) {
        pwVar6[(long)pwVar9] =
             ~*(ulong *)(lVar1 + (long)pwVar9 * 8) & *(ulong *)(lVar8 + (long)pwVar9 * 8);
      }
    }
    else {
      for (pwVar9 = (word *)0x0; pwVar10 != pwVar9; pwVar9 = (word *)((long)pwVar9 + 1)) {
        pwVar6[(long)pwVar9] =
             ~(*(ulong *)(lVar8 + (long)pwVar9 * 8) | *(ulong *)(lVar1 + (long)pwVar9 * 8));
      }
    }
    plVar5[8] = (long)pwVar6;
    iVar12 = iVar12 + 1;
    iVar7 = vVisited->nSize;
  }
  __assert_fail("!Abc_ObjIsPi(pNode)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abci/abcRefactor.c"
                ,0x61,
                "word *Abc_NodeConeTruth(Vec_Ptr_t *, Vec_Ptr_t *, int, Abc_Obj_t *, Vec_Ptr_t *, Vec_Ptr_t *)"
               );
}

Assistant:

word * Abc_NodeConeTruth( Vec_Ptr_t * vVars, Vec_Ptr_t * vFuncs, int nWordsMax, Abc_Obj_t * pRoot, Vec_Ptr_t * vLeaves, Vec_Ptr_t * vVisited )
{
    Abc_Obj_t * pNode;
    word * pTruth0, * pTruth1, * pTruth = NULL;
    int i, k, nWords = Abc_Truth6WordNum( Vec_PtrSize(vLeaves) );
    // get nodes in the cut without fanins in the DFS order
    Abc_NodeConeCollect( &pRoot, 1, vLeaves, vVisited, 0 );
    // set elementary functions
    Vec_PtrForEachEntry( Abc_Obj_t *, vLeaves, pNode, i )
        pNode->pCopy = (Abc_Obj_t *)Vec_PtrEntry( vVars, i );
    // prepare functions
    for ( i = Vec_PtrSize(vFuncs); i < Vec_PtrSize(vVisited); i++ )
        Vec_PtrPush( vFuncs, ABC_ALLOC(word, nWordsMax) );
    // compute functions for the collected nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vVisited, pNode, i )
    {
        assert( !Abc_ObjIsPi(pNode) );
        pTruth0 = (word *)Abc_ObjFanin0(pNode)->pCopy;
        pTruth1 = (word *)Abc_ObjFanin1(pNode)->pCopy;
        pTruth  = (word *)Vec_PtrEntry( vFuncs, i );
        if ( Abc_ObjFaninC0(pNode) )
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] = ~pTruth0[k] &  pTruth1[k];
        }
        else
        {
            if ( Abc_ObjFaninC1(pNode) )
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] & ~pTruth1[k];
            else
                for ( k = 0; k < nWords; k++ )
                    pTruth[k] =  pTruth0[k] &  pTruth1[k];
        }
        pNode->pCopy = (Abc_Obj_t *)pTruth;
    }
    return pTruth;
}